

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialRenderer.cpp
# Opt level: O3

void __thiscall
irr::video::COpenGL3MaterialRenderer::~COpenGL3MaterialRenderer(COpenGL3MaterialRenderer *this)

{
  COpenGL3MaterialRenderer *this_00;
  
  this_00 = (COpenGL3MaterialRenderer *)
            ((long)&(this->super_IMaterialRenderer)._vptr_IMaterialRenderer +
            (long)(this->super_IMaterialRenderer)._vptr_IMaterialRenderer[-3]);
  ~COpenGL3MaterialRenderer(this_00,&VTT);
  operator_delete(this_00,0x68);
  return;
}

Assistant:

COpenGL3MaterialRenderer::~COpenGL3MaterialRenderer()
{
	if (CallBack)
		CallBack->drop();

	if (Program) {
		GLuint shaders[8];
		GLint count;
		GL.GetAttachedShaders(Program, 8, &count, shaders);

		count = core::min_(count, 8);
		for (GLint i = 0; i < count; ++i)
			GL.DeleteShader(shaders[i]);
		GL.DeleteProgram(Program);
		Program = 0;
	}

	UniformInfo.clear();
}